

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQGenerator::Finalize(SQGenerator *this)

{
  SQObjectPtr *in_RDI;
  SQObjectPtr *newsize;
  sqvector<SQObjectPtr> *this_00;
  sqvector<SQObjectPtr> local_18;
  
  newsize = in_RDI + 4;
  this_00 = &local_18;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_00);
  sqvector<SQObjectPtr>::resize(this_00,(SQUnsignedInteger)newsize,in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::Null(in_RDI);
  return;
}

Assistant:

void Finalize(){_stack.resize(0);_closure.Null();}